

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::createInstance
          (ShaderOperatorCase *this,Context *context)

{
  bool bVar1;
  ShaderOperatorCaseInstance *this_00;
  ShaderEvaluator *evaluator;
  UniformSetup *uniformSetup;
  Context *context_local;
  ShaderOperatorCase *this_local;
  
  this_00 = (ShaderOperatorCaseInstance *)operator_new(0x250);
  bVar1 = (this->super_ShaderRenderCase).m_isVertexCase;
  evaluator = de::details::
              UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
              ::operator*(&(this->super_ShaderRenderCase).m_evaluator.
                           super_UniqueBase<const_vkt::sr::ShaderEvaluator,_de::DefaultDeleter<const_vkt::sr::ShaderEvaluator>_>
                         );
  uniformSetup = de::details::
                 UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                 ::operator*(&(this->super_ShaderRenderCase).m_uniformSetup.
                              super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                            );
  ShaderOperatorCaseInstance::ShaderOperatorCaseInstance
            (this_00,context,(bool)(bVar1 & 1),evaluator,uniformSetup,this->m_spec);
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* ShaderOperatorCase::createInstance (Context& context) const
{
	DE_ASSERT(m_evaluator != DE_NULL);
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new ShaderOperatorCaseInstance(context, m_isVertexCase, *m_evaluator, *m_uniformSetup, m_spec);
}